

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expressions.cpp
# Opt level: O0

void __thiscall
IRT::CExpressionList::CExpressionList
          (CExpressionList *this,
          unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
          *_expression)

{
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_20;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *local_18;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
  *_expression_local;
  CExpressionList *this_local;
  
  local_18 = _expression;
  _expression_local =
       (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)this;
  IExpression::IExpression(&this->super_IExpression);
  (this->super_IExpression).super_INode._vptr_INode = (_func_int **)&PTR_Accept_00238200;
  std::
  vector<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>,_std::allocator<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>_>_>
  ::vector(&this->expressions);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::unique_ptr
            (&local_20,_expression);
  Add(this,&local_20);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::~unique_ptr
            (&local_20);
  return;
}

Assistant:

IRT::CExpressionList::CExpressionList( std::unique_ptr<const IRT::CExpression> _expression ) {
    Add( std::move( _expression ));
}